

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_set_numalign(Integer value)

{
  char *in_RDI;
  ErrorType unaff_retaddr;
  ErrorLevel unaff_retaddr_00;
  char *in_stack_fffffffffffffff8;
  Boolean BVar1;
  
  ma_stats.calls[0x1b] = ma_stats.calls[0x1b] + 1;
  if (((long)in_RDI < 0) || (0x1e < (long)in_RDI)) {
    sprintf(ma_ebuf,"invalid alignment: %ld",in_RDI);
    ma_error(unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
    BVar1 = 0;
  }
  else {
    BVar1 = 1;
    ma_numalign = (Integer)in_RDI;
  }
  return BVar1;
}

Assistant:

public Boolean MA_set_numalign(Integer  value)
{
#ifdef STATS
    ma_stats.calls[(int)FID_MA_set_numalign]++;
#endif /* STATS */

    if ((value < 0) || (value > 30))
    {
        (void)sprintf(ma_ebuf,
            "invalid alignment: %ld",
            (size_t)value);
        ma_error(EL_Nonfatal, ET_External, "MA_set_numalign", ma_ebuf);
        return MA_FALSE;
    }
    ma_numalign = value;
    return MA_TRUE;
}